

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_relax_snode.h
# Opt level: O0

void __thiscall
Eigen::internal::SparseLUImpl<double,_int>::relax_snode
          (SparseLUImpl<double,_int> *this,int n,IndexVector *et,int relax_columns,
          IndexVector *descendants,IndexVector *relax_end)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  Scalar *pSVar4;
  Scalar local_44;
  int snode_start;
  int local_3c;
  int parent;
  int j;
  IndexVector *relax_end_local;
  IndexVector *descendants_local;
  DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *pDStack_20;
  int relax_columns_local;
  IndexVector *et_local;
  SparseLUImpl<double,_int> *pSStack_10;
  int n_local;
  SparseLUImpl<double,_int> *this_local;
  
  local_44 = -1;
  _parent = (DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)relax_end;
  relax_end_local = descendants;
  descendants_local._4_4_ = relax_columns;
  pDStack_20 = (DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)et;
  et_local._4_4_ = n;
  pSStack_10 = this;
  DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setConstant
            ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)relax_end,&local_44);
  DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)relax_end_local);
  for (local_3c = 0; local_3c < et_local._4_4_; local_3c = local_3c + 1) {
    pSVar4 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (pDStack_20,(long)local_3c);
    snode_start = *pSVar4;
    if (snode_start != et_local._4_4_) {
      pSVar4 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)relax_end_local
                          ,(long)local_3c);
      iVar1 = *pSVar4;
      pSVar4 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)relax_end_local
                          ,(long)snode_start);
      *pSVar4 = iVar1 + 1 + *pSVar4;
    }
  }
  local_3c = 0;
  while (local_3c < et_local._4_4_) {
    pSVar4 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (pDStack_20,(long)local_3c);
    iVar1 = local_3c;
    snode_start = *pSVar4;
    while( true ) {
      bVar2 = false;
      if (snode_start != et_local._4_4_) {
        pSVar4 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)
                            relax_end_local,(long)snode_start);
        bVar2 = *pSVar4 < descendants_local._4_4_;
      }
      iVar3 = local_3c;
      if (!bVar2) break;
      local_3c = snode_start;
      pSVar4 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         (pDStack_20,(long)snode_start);
      snode_start = *pSVar4;
    }
    pSVar4 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (_parent,(long)iVar1);
    *pSVar4 = iVar3;
    do {
      local_3c = local_3c + 1;
      pSVar4 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)relax_end_local
                          ,(long)local_3c);
    } while (*pSVar4 != 0 && local_3c < et_local._4_4_);
  }
  return;
}

Assistant:

void SparseLUImpl<Scalar,Index>::relax_snode (const Index n, IndexVector& et, const Index relax_columns, IndexVector& descendants, IndexVector& relax_end)
{
  
  // compute the number of descendants of each node in the etree
  Index j, parent; 
  relax_end.setConstant(emptyIdxLU);
  descendants.setZero();
  for (j = 0; j < n; j++) 
  {
    parent = et(j);
    if (parent != n) // not the dummy root
      descendants(parent) += descendants(j) + 1;
  }
  // Identify the relaxed supernodes by postorder traversal of the etree
  Index snode_start; // beginning of a snode 
  for (j = 0; j < n; )
  {
    parent = et(j);
    snode_start = j; 
    while ( parent != n && descendants(parent) < relax_columns ) 
    {
      j = parent; 
      parent = et(j);
    }
    // Found a supernode in postordered etree, j is the last column 
    relax_end(snode_start) = j; // Record last column
    j++;
    // Search for a new leaf
    while (descendants(j) != 0 && j < n) j++;
  } // End postorder traversal of the etree
  
}